

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPlanning.cpp
# Opt level: O2

ValueFunctionPOMDPDiscrete *
AlphaVectorPlanning::ImportValueFunction
          (ValueFunctionPOMDPDiscrete *__return_storage_ptr__,string *filename)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  istream *piVar5;
  E *this;
  long lVar6;
  Index local_444;
  int local_43c;
  long local_438;
  vector<long_long,_std::allocator<long_long>_> actionBetaI;
  vector<double,_std::allocator<double>_> values;
  string buffer;
  BGPolicyIndex actionOrBetaI;
  double value;
  istringstream is;
  long local_3b0;
  ifstream fp;
  byte abStack_218 [488];
  
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(&fp,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(_fp + -0x18)] & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "AlphaVectorPlanning::ImportValueFunction: failed to ");
    poVar4 = std::operator<<(poVar4,"open file ");
    poVar4 = std::operator<<(poVar4,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  bVar2 = true;
  local_43c = -1;
  local_444 = 0;
  local_438 = -1;
  iVar1 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          iVar3 = iVar1;
          piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&fp,(string *)&buffer);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 2) != 0) {
            std::__cxx11::string::~string((string *)&buffer);
            std::ifstream::~ifstream(&fp);
            std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                      (&actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&values.super__Vector_base<double,_std::allocator<double>_>);
            return __return_storage_ptr__;
          }
          iVar1 = 0;
        } while (iVar3 == 2);
        if (iVar3 == 0) break;
        if (values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_finish = values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
        }
        std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
        while( true ) {
          piVar5 = std::istream::_M_extract<double>((double *)&is);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          std::vector<double,_std::allocator<double>_>::push_back(&values,&value);
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)&is);
        if (bVar2) {
          local_43c = (int)((ulong)((long)values.super__Vector_base<double,_std::allocator<double>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)values.super__Vector_base<double,_std::allocator<double>_>.
                                         _M_impl.super__Vector_impl_data._M_start) >> 3);
        }
        AlphaVector::AlphaVector((AlphaVector *)&is,(long)local_43c);
        _is = local_444;
        AlphaVector::SetValues((AlphaVector *)&is,&values);
        if (local_438 != local_3b0) {
          AlphaVector::SetBetaI((AlphaVector *)&is,local_438);
        }
        std::vector<AlphaVector,_std::allocator<AlphaVector>_>::push_back
                  (__return_storage_ptr__,(AlphaVector *)&is);
        AlphaVector::~AlphaVector((AlphaVector *)&is);
        bVar2 = false;
        iVar1 = 2;
      }
      if (actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&buffer,_S_in);
      while( true ) {
        piVar5 = std::istream::_M_extract<long_long>((longlong *)&is);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        std::vector<long_long,_std::allocator<long_long>_>::push_back(&actionBetaI,&actionOrBetaI);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&is);
      lVar6 = (long)actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      if (lVar6 != 1) break;
      local_444 = Globals::CastLIndexToIndex
                            (*actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      local_438 = -1;
      iVar1 = 1;
    }
    if (lVar6 != 2) break;
    local_444 = Globals::CastLIndexToIndex
                          (*actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    local_438 = actionBetaI.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start[1];
    iVar1 = 1;
  }
  this = (E *)__cxa_allocate_exception(0x28);
  E::E(this,"AlphaVectorPlanning::ImportValueFunction parse error");
  __cxa_throw(this,&E::typeinfo,E::~E);
}

Assistant:

ValueFunctionPOMDPDiscrete 
AlphaVectorPlanning::ImportValueFunction(const string & filename)
{
    ValueFunctionPOMDPDiscrete V;

    int lineState=0; /* lineState=0 -> read action
                      * lineState=1 -> read values
                      * lineState=2 -> empty line, skip */
    int nrStates=-1;
    bool first=true;
    Index action=0;
    AlphaVector::BGPolicyIndex betaI=-1;
    double value;
    vector<double> values;
    vector<AlphaVector::BGPolicyIndex> actionBetaI;
    AlphaVector::BGPolicyIndex actionOrBetaI;

    ifstream fp(filename.c_str());
    if(!fp)
    {
        cerr << "AlphaVectorPlanning::ImportValueFunction: failed to "
             << "open file " << filename << endl;            
    }

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        switch(lineState)
        {
        case 0:
            // read action
//            action=strtol(buffer,NULL,10);
            actionBetaI.clear();
            {
                istringstream is(buffer);
                while(is >> actionOrBetaI)
                    actionBetaI.push_back(actionOrBetaI);
            }

            switch(actionBetaI.size())
            {
            case 1:
                action=CastLIndexToIndex(actionBetaI[0]);
                betaI=-1;
                break;
            case 2:
                action=CastLIndexToIndex(actionBetaI[0]);
                betaI=actionBetaI[1];
                break;
            default:
                throw(E("AlphaVectorPlanning::ImportValueFunction parse error"));
            }

            lineState++;
            break;
        case 1:
            // read values
            values.clear();

            {
                istringstream is(buffer);
                while(is >> value)
                    values.push_back(value);
            }
            
            if(first)
            {
                nrStates=values.size();
                first=false;
            }
            
            // create new alpha vector and store it
            {
                AlphaVector alpha(nrStates);
                alpha.SetAction(action);
                alpha.SetValues(values);
                // only set betaI if different than default, to avoid
                // setting it to -1
                if(betaI!=alpha.GetBetaI())
                    alpha.SetBetaI(betaI);

#if DEBUG_AlphaVectorPlanning_ImportValueFunction
                cout << "AlphaVectorPlanning::ImportValueFunction "
                     << "added vector " << V.size() << " for action " 
                     << action << " betaI " << betaI << endl;
#endif

                V.push_back(alpha);
            }

            lineState++;
            break;
        case 2:
            // do nothing, line is empty
            lineState=0;
            break;
        }
    }

    return(V);
}